

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

int Gia_ManResubAddNode(Gia_ResbMan_t *p,int iLit0,int iLit1,int Type)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int Entry2;
  int local_38;
  int iFan1;
  int iFan0;
  int fFlip;
  int iNode;
  int Type_local;
  int iLit1_local;
  int iLit0_local;
  Gia_ResbMan_t *p_local;
  
  iVar1 = Vec_PtrSize(p->vDivs);
  iVar2 = Vec_IntSize(p->vGates);
  local_38 = iLit1;
  iVar3 = iLit0;
  if ((Type == 2) != iLit1 < iLit0) {
    local_38 = iLit0;
    iVar3 = iLit1;
  }
  if (iLit0 != iLit1) {
    if (Type == 2) {
      if (iVar3 <= local_38) {
        __assert_fail("iFan0 > iFan1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                      ,0x45b,"int Gia_ManResubAddNode(Gia_ResbMan_t *, int, int, int)");
      }
    }
    else if (local_38 <= iVar3) {
      __assert_fail("iFan0 < iFan1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                    ,0x45d,"int Gia_ManResubAddNode(Gia_ResbMan_t *, int, int, int)");
    }
    p_00 = p->vGates;
    iVar3 = Abc_LitNotCond(iVar3,(uint)(Type == 1));
    Entry2 = Abc_LitNotCond(local_38,(uint)(Type == 1));
    Vec_IntPushTwo(p_00,iVar3,Entry2);
    iVar3 = Abc_Var2Lit(iVar1 + iVar2 / 2,(uint)(Type == 1));
    return iVar3;
  }
  __assert_fail("iLit0 != iLit1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                ,0x459,"int Gia_ManResubAddNode(Gia_ResbMan_t *, int, int, int)");
}

Assistant:

int Gia_ManResubAddNode( Gia_ResbMan_t * p, int iLit0, int iLit1, int Type )
{
    int iNode = Vec_PtrSize(p->vDivs) + Vec_IntSize(p->vGates)/2;
    int fFlip = (Type == 2) ^ (iLit0 > iLit1);
    int iFan0 = fFlip ? iLit1 : iLit0;
    int iFan1 = fFlip ? iLit0 : iLit1;
    assert( iLit0 != iLit1 );
    if ( Type == 2 )
        assert( iFan0 > iFan1 );
    else
        assert( iFan0 < iFan1 );
    Vec_IntPushTwo( p->vGates, Abc_LitNotCond(iFan0, Type==1), Abc_LitNotCond(iFan1, Type==1) );
    return Abc_Var2Lit( iNode, Type==1 );
}